

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O1

void __thiscall
Omega_h::Overlay::Overlay
          (Overlay *this,int *argc,char ***argv,Vector<3> *overlayGridCenter,double cellSize,
          size_t Nx,size_t Ny,size_t Nz)

{
  _Rb_tree_header *p_Var1;
  Mesh *__return_storage_ptr__;
  double *pdVar2;
  int *piVar3;
  iterator iVar4;
  double x_00;
  _Alloc_hider _Var5;
  Alloc *pAVar6;
  LO LVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int i;
  pointer pcVar11;
  undefined1 auVar12 [16];
  double dVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Write<double> new_coords;
  Reals coords;
  Vector<3> x;
  Vector<3> diff;
  Vector<3> c_1;
  string local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  Write<double> local_1d8;
  Write<double> local_1c8;
  double local_1b8 [3];
  Vector<3> *local_1a0;
  Alloc *local_198;
  element_type *local_190;
  CommPtr local_188 [3];
  pointer local_158;
  pointer psStack_150;
  pointer local_148;
  pointer psStack_140;
  undefined1 local_138 [16];
  Alloc *local_120;
  pointer psStack_118;
  pointer local_110;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  element_type *local_f8;
  Adj local_f0;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  this->cell_size = cellSize;
  p_Var1 = &(this->library).timers._M_t._M_impl.super__Rb_tree_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->library).world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->library).world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->library).self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->library).self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cellSize;
  Library::initialize(&this->library,"9.34.13-sha.dc235450+00000010000000001",argc,argv);
  Library::world(&this->library);
  __return_storage_ptr__ = &this->mesh;
  auVar12._8_4_ = (int)(Nx >> 0x20);
  auVar12._0_8_ = Nx;
  auVar12._12_4_ = 0x45300000;
  dVar15 = auVar12._8_8_ - 1.9342813113834067e+25;
  x_00 = (dVar15 + ((double)CONCAT44(0x43300000,(LO)Nx) - 4503599627370496.0)) * (double)local_1e8;
  auVar13._8_4_ = (int)(Ny >> 0x20);
  auVar13._0_8_ = Ny;
  auVar13._12_4_ = 0x45300000;
  psStack_140 = (pointer)(auVar13._8_8_ - 1.9342813113834067e+25);
  local_148 = (pointer)(((double)psStack_140 +
                        ((double)CONCAT44(0x43300000,(LO)Ny) - 4503599627370496.0)) *
                       (double)local_1e8);
  auVar14._8_4_ = (int)(Nz >> 0x20);
  auVar14._0_8_ = Nz;
  auVar14._12_4_ = 0x45300000;
  psStack_150 = (pointer)(auVar14._8_8_ - 1.9342813113834067e+25);
  local_158 = (pointer)(((double)psStack_150 +
                        ((double)CONCAT44(0x43300000,(LO)Nz) - 4503599627370496.0)) *
                       (double)local_1e8);
  local_138._8_4_ = SUB84(dVar15,0);
  local_138._0_8_ = x_00;
  local_138._12_4_ = (int)((ulong)dVar15 >> 0x20);
  build_box(__return_storage_ptr__,local_188,OMEGA_H_HYPERCUBE,x_00,(Real)local_148,(Real)local_158,
            (LO)Nx,(LO)Ny,(LO)Nz,false);
  local_1a0 = overlayGridCenter;
  if (local_188[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1e8 = &this->silly_cells;
  local_1e0 = &this->silly_edges;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LVar7 = Omega_h::Mesh::nregions(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_1e8,(long)LVar7);
  LVar7 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_faces,(long)LVar7);
  LVar7 = Omega_h::Mesh::nedges(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_1e0,(long)LVar7);
  LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_nodes,(long)LVar7);
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nregions(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_208._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (local_1e8,iVar4,(unsigned_long *)&local_208);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_208._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->silly_faces,iVar4,(unsigned_long *)&local_208);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nedges(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_208._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (local_1e0,iVar4,(unsigned_long *)&local_208);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_208._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->silly_nodes,iVar4,(unsigned_long *)&local_208);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  Omega_h::Mesh::coords((Mesh *)&local_198);
  LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
  Write<double>::Write(&local_1d8,LVar7 * 3,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1b8[2] = (local_1a0->super_Few<double,_3>).array_[2];
  local_1b8[0] = (local_1a0->super_Few<double,_3>).array_[0];
  local_1b8[1] = (local_1a0->super_Few<double,_3>).array_[1];
  local_208._M_dataplus._M_p = (pointer)((double)local_138._0_8_ * 0.5);
  local_208._M_string_length = (size_type)((double)local_148 * 0.5);
  local_208.field_2._M_allocated_capacity = (size_type)((double)local_158 * 0.5);
  lVar8 = 0;
  do {
    (&local_120)[lVar8] = (Alloc *)(local_1b8[lVar8] - (double)(&local_208._M_dataplus)[lVar8]._M_p)
    ;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if (LVar7 <= lVar8) break;
    uVar9 = lVar8 * 0x18 & 0x7fffffff8;
    local_208.field_2._M_allocated_capacity = (size_type)local_110;
    local_208._M_dataplus._M_p = (pointer)local_120;
    local_208._M_string_length = (size_type)psStack_118;
    local_1b8[2] = *(double *)((long)&(local_190->srcs_).write_.shared_alloc_.direct_ptr + uVar9);
    pdVar2 = (double *)((long)&local_190->library_ + uVar9);
    local_1b8[0] = *pdVar2;
    local_1b8[1] = pdVar2[1];
    lVar10 = 0;
    do {
      (&local_108)[lVar10] =
           (element_type *)(local_1b8[lVar10] + (double)(&local_208._M_dataplus)[lVar10]._M_p);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    *(element_type **)((long)local_1d8.shared_alloc_.direct_ptr + uVar9 + 0x10) = local_f8;
    *(undefined8 *)((long)local_1d8.shared_alloc_.direct_ptr + uVar9) = local_108;
    ((undefined8 *)((long)local_1d8.shared_alloc_.direct_ptr + uVar9))[1] = _Stack_100._M_pi;
    lVar8 = lVar8 + 1;
  }
  local_1c8.shared_alloc_.alloc = local_1d8.shared_alloc_.alloc;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.shared_alloc_.alloc = (Alloc *)((local_1d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1d8.shared_alloc_.alloc)->use_count = (local_1d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1c8.shared_alloc_.direct_ptr = local_1d8.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)&local_208,&local_1c8);
  Omega_h::Mesh::set_coords(__return_storage_ptr__,(Reals *)&local_208);
  _Var5._M_p = local_208._M_dataplus._M_p;
  if (((ulong)local_208._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_208._M_dataplus._M_p != (Alloc *)0x0) {
    piVar3 = (int *)(local_208._M_dataplus._M_p + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_208._M_dataplus._M_p);
      operator_delete(_Var5._M_p,0x48);
    }
  }
  pAVar6 = local_1c8.shared_alloc_.alloc;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1c8.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  Omega_h::Mesh::ask_down(&local_60,__return_storage_ptr__,2,0);
  Adj::~Adj(&local_60);
  Omega_h::Mesh::ask_down(&local_90,__return_storage_ptr__,3,0);
  Adj::~Adj(&local_90);
  Omega_h::Mesh::ask_down(&local_c0,__return_storage_ptr__,3,2);
  Adj::~Adj(&local_c0);
  Omega_h::Mesh::ask_up(&local_f0,__return_storage_ptr__,2,3);
  Adj::~Adj(&local_f0);
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1d8.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1d8.shared_alloc_.alloc);
      operator_delete(local_1d8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    piVar3 = &local_198->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_198);
      operator_delete(local_198,0x48);
    }
  }
  return;
}

Assistant:

Overlay::Overlay(
    int* argc, char*** argv, const Omega_h::Vector<3>& overlayGridCenter,
    double cellSize, size_t Nx, size_t Ny, size_t Nz
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm
#endif
    )
    : cell_size(cellSize),
      library(argc, argv
#ifdef OMEGA_H_USE_MPI
          ,
          comm
#endif
          ),
      mesh(build_box(library.world(), OMEGA_H_HYPERCUBE, Nx * cellSize,
          Ny * cellSize, Nz * cellSize, LO(Nx), LO(Ny), LO(Nz))) {
  silly_cells.reserve(size_t(mesh.nregions()));
  silly_faces.reserve(size_t(mesh.nfaces()));
  silly_edges.reserve(size_t(mesh.nedges()));
  silly_nodes.reserve(size_t(mesh.nverts()));
  for (int i = 0; i < mesh.nregions(); ++i) silly_cells.push_back(size_t(i));
  for (int i = 0; i < mesh.nfaces(); ++i) silly_faces.push_back(size_t(i));
  for (int i = 0; i < mesh.nedges(); ++i) silly_edges.push_back(size_t(i));
  for (int i = 0; i < mesh.nverts(); ++i) silly_nodes.push_back(size_t(i));
  auto coords = mesh.coords();
  auto new_coords = Write<double>(mesh.nverts() * 3);
  auto diff = overlayGridCenter - vector_3(Nx * cellSize / 2.0,
                                      Ny * cellSize / 2.0, Nz * cellSize / 2.0);
  for (int i = 0; i < mesh.nverts(); ++i) {
    auto x = get_vector<3>(coords, i);
    x += diff;
    set_vector(new_coords, i, x);
  }
  mesh.set_coords(new_coords);
  mesh.ask_down(FACE, VERT);
  mesh.ask_down(REGION, VERT);
  mesh.ask_down(REGION, FACE);
  mesh.ask_up(FACE, REGION);
}